

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

string * __thiscall
program_options::error_with_option_name::get_canonical_option_name_abi_cxx11_
          (error_with_option_name *this)

{
  const_iterator this_00;
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  pointer ppVar2;
  const_iterator text;
  char __rhs;
  long in_RSI;
  string *in_RDI;
  string option_name;
  string original_token;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  allocator<char> *in_stack_fffffffffffffe40;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  string local_168 [36];
  undefined4 local_144;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  _Base_ptr local_f8;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [32];
  _Base_ptr local_a8;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [32];
  _Base_ptr local_58;
  allocator<char> local_39;
  string local_38 [32];
  _Base_ptr local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(in_stack_fffffffffffffe08,(key_type *)0x138bf5);
  local_18 = this_00._M_node;
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x138c16);
  lVar1 = std::__cxx11::string::length();
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  if (lVar1 != 0) {
    __a = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,__a);
    local_a8 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(in_stack_fffffffffffffe08,(key_type *)0x138dd5);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x138df6);
    strip_prefixes(in_stack_fffffffffffffe18);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,__a);
    text = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(in_stack_fffffffffffffe08,(key_type *)0x138e73);
    local_f8 = text._M_node;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x138e94);
    strip_prefixes((string *)text._M_node);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
    if ((*(int *)(in_RSI + 0x10) == 1) || (*(int *)(in_RSI + 0x10) == 0x1000)) {
      get_canonical_option_prefix_abi_cxx11_((error_with_option_name *)this_00._M_node);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     text._M_node,in_stack_fffffffffffffe10);
      std::__cxx11::string::~string(local_140);
    }
    else if ((*(int *)(in_RSI + 0x10) == 0) || (lVar1 = std::__cxx11::string::length(), lVar1 == 0))
    {
      std::__cxx11::string::string((string *)in_RDI,local_f0);
    }
    else {
      get_canonical_option_prefix_abi_cxx11_((error_with_option_name *)this_00._M_node);
      std::__cxx11::string::operator[]((ulong)local_a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     text._M_node,__rhs);
      std::__cxx11::string::~string(local_168);
    }
    local_144 = 1;
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_a0);
    return in_RDI;
  }
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  local_58 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(in_stack_fffffffffffffe08,(key_type *)0x138ca3);
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x138cc4);
  std::__cxx11::string::string((string *)in_RDI,(string *)&ppVar2->second);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  return in_RDI;
}

Assistant:

std::string error_with_option_name::get_canonical_option_name() const
{
    if (!m_substitutions.find("option")->second.length())
        return m_substitutions.find("original_token")->second;

    std::string original_token   = strip_prefixes(m_substitutions.find("original_token")->second);
    std::string option_name      = strip_prefixes(m_substitutions.find("option")->second);

    //  For long options, use option name
    if (m_option_style == command_line_style::allow_long        ||
         m_option_style == command_line_style::allow_long_disguise)
        return get_canonical_option_prefix() + option_name;

    //  For short options use first letter of original_token
    if (m_option_style && original_token.length())
        return get_canonical_option_prefix() + original_token[0];

    // no prefix
    return option_name;
}